

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O2

string * __thiscall
SchemeSpecialForm::external_repr_abi_cxx11_(string *__return_storage_ptr__,SchemeSpecialForm *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"<special form ",&this->name);
  std::operator+(__return_storage_ptr__,&local_30,">");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string SchemeSpecialForm::external_repr() const
{
    return "<special form " + name + ">";
}